

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress_bar.h
# Opt level: O2

void __thiscall OutputBox::Cerror(OutputBox *this,string *err,string *title)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string complete_err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string((string *)&complete_err,"",(allocator *)&local_80);
  bVar1 = std::operator!=(title,"");
  if (bVar1) {
    std::operator+(&local_80,title,":");
    PrintData(this,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::assign((char *)&complete_err);
  }
  std::operator+(&local_40," ERROR: [",err);
  std::operator+(&local_80,&local_40,"]");
  std::__cxx11::string::append((string *)&complete_err);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_40);
  PrintData(this,&complete_err);
  PrintSeparatorLine(this);
  exit(1);
}

Assistant:

void Cerror(const std::string& err, const std::string& title = "")
    {
        std::string complete_err = "";
        if (title != "") {
            PrintData(title + ":");
            complete_err = " ";
        }
        complete_err += " ERROR: [" + err + "]";
        PrintData(complete_err);
        PrintSeparatorLine();
        exit(EXIT_FAILURE);

        /*

        If the title is specified this function will print:

        | title:                                                                     |
        |  ERROR: [err]                                                              |
        +----------------------------------------------------------------------------+

        otherwise:

        |  ERROR: [err]                                                              |
        +----------------------------------------------------------------------------+

        */
    }